

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateMergingCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  bool bVar1;
  MessageLite *pMVar2;
  EnumDescriptor *pEVar3;
  char *pcVar4;
  size_t sVar5;
  string_view text;
  
  this_00 = (this->super_ImmutableEnumFieldGenerator).descriptor_;
  pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                     (&(this_00->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__00832a20);
  if (*(char *)((long)&pMVar2[1]._internal_metadata_.ptr_ + 4) == '\0') {
    pEVar3 = FieldDescriptor::enum_type(this_00);
    if (pEVar3 != (EnumDescriptor *)0x0) {
      pEVar3 = FieldDescriptor::enum_type(this_00);
      bVar1 = EnumDescriptor::is_closed(pEVar3);
      if (!bVar1) {
        pcVar4 = "set$capitalized_name$Value(other.get$capitalized_name$Value());\n";
        sVar5 = 0x40;
        goto LAB_0036e53e;
      }
    }
  }
  pcVar4 = "set$capitalized_name$(other.get$capitalized_name$());\n";
  sVar5 = 0x36;
LAB_0036e53e:
  text._M_str = pcVar4;
  text._M_len = sVar5;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableEnumFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_)) {
    printer->Print(
        variables_,
        "set$capitalized_name$Value(other.get$capitalized_name$Value());\n");
  } else {
    printer->Print(variables_,
                   "set$capitalized_name$(other.get$capitalized_name$());\n");
  }
}